

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool __thiscall
Fossilize::StateRecorder::Impl::remap_descriptor_set_layout_ci
          (Impl *this,VkDescriptorSetLayoutCreateInfo *info)

{
  VkDescriptorSetLayoutBinding *pVVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  VkSampler *out_sampler;
  bool bVar5;
  bool bVar6;
  
  bVar5 = info->bindingCount == 0;
  if (!bVar5) {
    uVar4 = 0;
    do {
      pVVar1 = info->pBindings;
      out_sampler = pVVar1[uVar4].pImmutableSamplers;
      if ((out_sampler == (VkSampler *)0x0) ||
         (VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER < pVVar1[uVar4].descriptorType)) {
LAB_0012ec12:
        bVar2 = false;
      }
      else {
        bVar6 = pVVar1[uVar4].descriptorCount != 0;
        bVar2 = false;
        if (bVar6) {
          bVar2 = remap_sampler_handle(this,*out_sampler,out_sampler);
          if (bVar2) {
            uVar3 = 1;
            do {
              out_sampler = out_sampler + 1;
              bVar6 = uVar3 < pVVar1[uVar4].descriptorCount;
              bVar2 = false;
              if (!bVar6) goto LAB_0012ec0a;
              bVar2 = remap_sampler_handle(this,*out_sampler,out_sampler);
              uVar3 = uVar3 + 1;
            } while (bVar2);
            bVar2 = true;
          }
          else {
            bVar2 = true;
          }
        }
LAB_0012ec0a:
        if (!bVar6) goto LAB_0012ec12;
      }
      if (bVar2) {
        return bVar5;
      }
      uVar4 = uVar4 + 1;
      bVar6 = uVar4 < info->bindingCount;
      bVar5 = !bVar6;
    } while (bVar6);
  }
  return bVar5;
}

Assistant:

bool StateRecorder::Impl::remap_descriptor_set_layout_ci(VkDescriptorSetLayoutCreateInfo *info)
{
	for (uint32_t i = 0; i < info->bindingCount; i++)
	{
		auto &b = const_cast<VkDescriptorSetLayoutBinding &>(info->pBindings[i]);
		if (b.pImmutableSamplers &&
		    (b.descriptorType == VK_DESCRIPTOR_TYPE_SAMPLER ||
		     b.descriptorType == VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER))
		{
			auto *immutable_samplers = const_cast<VkSampler *>(b.pImmutableSamplers);
			for (uint32_t j = 0; j < b.descriptorCount; j++)
				if (!remap_sampler_handle(immutable_samplers[j], &immutable_samplers[j]))
					return false;
		}
	}

	return true;
}